

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileFilterPushdown
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          MultiFileBindData *data,vector<unsigned_long,_true> *column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> filters)

{
  pointer pMVar1;
  type pMVar2;
  optional_ptr<duckdb::TableFilterSet,_true> filters_local;
  
  if (filters.ptr == (TableFilterSet *)0x0) {
    *(undefined8 *)&this->super_TableFunction = 0;
  }
  else {
    filters_local = filters;
    pMVar1 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&data->multi_file_reader);
    pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&data->file_list);
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&filters_local);
    (**(code **)(*(long *)pMVar1 + 0x30))
              (this,pMVar1,context,pMVar2,&data->file_options,&data->names,&data->types,column_ids,
               filters_local.ptr);
  }
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

static unique_ptr<MultiFileList> MultiFileFilterPushdown(ClientContext &context, const MultiFileBindData &data,
	                                                         const vector<column_t> &column_ids,
	                                                         optional_ptr<TableFilterSet> filters) {
		if (!filters) {
			return nullptr;
		}
		auto new_list = data.multi_file_reader->DynamicFilterPushdown(context, *data.file_list, data.file_options,
		                                                              data.names, data.types, column_ids, *filters);
		return new_list;
	}